

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandIf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Abc_Ntk_t *pAVar7;
  size_t sVar8;
  If_DsdMan_t *pIVar9;
  Abc_Ntk_t *pNtk;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  double dVar13;
  If_Par_t Pars;
  char Buffer [100];
  char LutSize [100];
  If_Par_t local_240;
  Abc_Frame_t *local_110;
  undefined6 local_108;
  undefined2 uStack_102;
  undefined6 uStack_100;
  undefined8 local_98 [13];
  
  local_110 = pAbc;
  pAVar7 = Abc_FrameReadNtk(pAbc);
  If_ManSetDefaultPars(&local_240);
  local_240.pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
  Extra_UtilGetoptReset();
LAB_002142ff:
  iVar2 = Extra_UtilGetopt(argc,argv,"KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh");
  iVar3 = globalUtilOptind;
  switch(iVar2) {
  case 0x41:
    if (globalUtilOptind < argc) {
      local_240.nAreaIters = atoi(argv[globalUtilOptind]);
      uVar5 = local_240.nAreaIters;
      goto joined_r0x002143f0;
    }
    pcVar12 = "Command line switch \"-A\" should be followed by a positive integer.\n";
    break;
  case 0x42:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x68:
  case 0x75:
  case 0x77:
    goto switchD_00214320_caseD_42;
  case 0x43:
    if (globalUtilOptind < argc) {
      local_240.nCutsMax = atoi(argv[globalUtilOptind]);
      uVar5 = local_240.nCutsMax;
      goto joined_r0x002143f0;
    }
    pcVar12 = "Command line switch \"-C\" should be followed by a positive integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      dVar13 = atof(argv[globalUtilOptind]);
      local_240.DelayTarget = (float)dVar13;
      globalUtilOptind = iVar3 + 1;
      if (local_240.DelayTarget <= 0.0) goto switchD_00214320_caseD_42;
      goto LAB_002142ff;
    }
    pcVar12 = "Command line switch \"-D\" should be followed by a floating point number.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      dVar13 = atof(argv[globalUtilOptind]);
      local_240.Epsilon = (float)dVar13;
      globalUtilOptind = iVar3 + 1;
      if ((local_240.Epsilon < 0.0) || (1.0 < local_240.Epsilon)) goto switchD_00214320_caseD_42;
      goto LAB_002142ff;
    }
    pcVar12 = "Command line switch \"-E\" should be followed by a floating point number.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      local_240.nFlowIters = atoi(argv[globalUtilOptind]);
      uVar5 = local_240.nFlowIters;
      goto joined_r0x002143f0;
    }
    pcVar12 = "Command line switch \"-F\" should be followed by a positive integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      uVar5 = atoi(argv[globalUtilOptind]);
      local_240.nGateSize = uVar5;
LAB_00214597:
      globalUtilOptind = iVar3 + 1;
      if ((int)uVar5 < 2) goto switchD_00214320_caseD_42;
      goto LAB_002142ff;
    }
    pcVar12 = 
    "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n";
    break;
  case 0x4b:
    if (globalUtilOptind < argc) {
      local_240.nLutSize = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (local_240.nLutSize < 0) goto switchD_00214320_caseD_42;
      local_240.pLutLib = (If_LibLut_t *)0x0;
      goto LAB_002142ff;
    }
    pcVar12 = "Command line switch \"-K\" should be followed by a positive integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar5 = atoi(argv[globalUtilOptind]);
      local_240.nNonDecLimit = uVar5;
      goto LAB_00214597;
    }
    pcVar12 = 
    "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n";
    break;
  case 0x52:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-R\" should be followed by a floating point number.\n";
      iVar3 = 0;
      iVar2 = 1;
      goto LAB_002147af;
    }
    local_240.nRelaxRatio = atoi(argv[globalUtilOptind]);
    uVar5 = local_240.nRelaxRatio;
joined_r0x002143f0:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar5 < 0) goto switchD_00214320_caseD_42;
    goto LAB_002142ff;
  case 0x53:
    if (globalUtilOptind < argc) {
      local_240.pLutStruct = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      sVar8 = strlen(local_240.pLutStruct);
      if ((sVar8 & 0xfffffffffffffffe) == 2) goto LAB_002142ff;
      pcVar12 = 
      "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
      ;
    }
    else {
      pcVar12 = "Command line switch \"-S\" should be followed by string.\n";
    }
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      local_240.nStructType = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (2 < (uint)local_240.nStructType) goto switchD_00214320_caseD_42;
      goto LAB_002142ff;
    }
    pcVar12 = "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-W\" should be followed by a floating point number.\n";
      break;
    }
    dVar13 = atof(argv[globalUtilOptind]);
    local_240.WireDelay = (float)dVar13;
    globalUtilOptind = iVar3 + 1;
    if (local_240.WireDelay < 0.0) {
switchD_00214320_caseD_42:
      if ((local_240.DelayTarget != -1.0) || (NAN(local_240.DelayTarget))) {
        sprintf((char *)&local_108,"%.2f",(double)local_240.DelayTarget);
      }
      else {
        uStack_100 = 0x656c626973;
        local_108 = 0x702074736562;
        uStack_102 = 0x736f;
      }
      if (local_240.nLutSize == 0xffffffff) {
        local_98[0] = 0x7972617262696c;
      }
      else {
        sprintf((char *)local_98,"%d");
      }
      Abc_Print(-2,"usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n");
      Abc_Print(-2,"\t           performs FPGA technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n",0x21,
                local_98);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n",
                (ulong)(uint)local_240.nCutsMax);
      Abc_Print(-2,
                "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)local_240.nFlowIters);
      Abc_Print(-2,
                "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)(uint)local_240.nAreaIters);
      Abc_Print(-2,"\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n"
                ,(ulong)(uint)local_240.nGateSize);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)local_240.nRelaxRatio);
      Abc_Print(-2,"\t-N num   : the max size of non-decomposable nodes [default = unused]\n",
                (ulong)(uint)local_240.nNonDecLimit);
      Abc_Print(-2,"\t-T num   : the type of LUT structures [default = any]\n");
      Abc_Print(-2,"\t-X num   : delay of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)local_240.nAndDelay);
      Abc_Print(-2,"\t-Y num   : area of AND-gate in LUT library units [default = %d]\n",
                (ulong)(uint)local_240.nAndArea);
      Abc_Print(-2,"\t-D float : sets the delay constraint for the mapping [default = %s]\n",
                &local_108);
      Abc_Print(-2,"\t-E float : sets epsilon used for tie-breaking [default = %f]\n",
                (double)local_240.Epsilon);
      Abc_Print(-2,"\t-W float : sets wire delay between adjects LUTs [default = %f]\n",
                (double)local_240.WireDelay);
      pcVar12 = "not used";
      if (local_240.pLutStruct != (char *)0x0) {
        pcVar12 = local_240.pLutStruct;
      }
      Abc_Print(-2,"\t-S str   : string representing the LUT structure [default = %s]\n",pcVar12);
      pcVar11 = "yes";
      pcVar12 = "yes";
      if (local_240.fPreprocess == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles preprocessing using several starting points [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fArea == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (local_240.fExpRed == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-r       : enables expansion/reduction of the best cuts [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fLatchPaths == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (local_240.fEdge == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-e       : uses edge-based cut selection heuristics [default = %s]\n",pcVar12)
      ;
      pcVar12 = "yes";
      if (local_240.fPower == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-p       : uses power-aware cut selection heuristics [default = %s]\n",pcVar12
               );
      pcVar12 = "yes";
      if (local_240.fCutMin == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (local_240.fDelayOptLut == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fBidec == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseBat == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-b       : toggles the use of one special feature [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (local_240.fDelayOpt == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles delay optimization by SOP balancing [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fDsdBalance == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-x       : toggles delay optimization by DSD balancing [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fUserRecLib == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-y       : toggles delay optimization with recorded library [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseBuffs == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (local_240.fEnableCheck07 == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-j       : toggles enabling additional check [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseCofVars == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-i       : toggles using cofactoring variables [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseDsdTune == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (local_240.fDoAverage == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseDsd == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-n       : toggles computing DSDs of the cut functions [default = %s]\n",
                pcVar12);
      pcVar12 = "yes";
      if (local_240.fUseTtPerm == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-c       : toggles computing truth tables in a new way [default = %s]\n",
                pcVar12);
      if (local_240.fVerbose == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar11);
      pcVar12 = "\t-h       : prints the command usage\n";
      iVar3 = -2;
LAB_00214c96:
      Abc_Print(iVar3,pcVar12);
      return 1;
    }
    goto LAB_002142ff;
  case 0x58:
    if (globalUtilOptind < argc) {
      local_240.nAndDelay = atoi(argv[globalUtilOptind]);
      uVar5 = local_240.nAndArea;
      goto joined_r0x002143f0;
    }
    pcVar12 = "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x59:
    if (globalUtilOptind < argc) {
      local_240.nAndArea = atoi(argv[globalUtilOptind]);
      uVar5 = local_240.nAndDelay;
      goto joined_r0x002143f0;
    }
    pcVar12 = "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n";
    break;
  case 0x61:
    local_240.fArea = local_240.fArea ^ 1;
    goto LAB_002142ff;
  case 0x62:
    local_240.fUseBat = local_240.fUseBat ^ 1;
    goto LAB_002142ff;
  case 99:
    local_240.fUseTtPerm = local_240.fUseTtPerm ^ 1;
    goto LAB_002142ff;
  case 100:
    local_240.fBidec = local_240.fBidec ^ 1;
    goto LAB_002142ff;
  case 0x65:
    local_240.fEdge = local_240.fEdge ^ 1;
    goto LAB_002142ff;
  case 0x66:
    local_240.fFancy._0_1_ = (byte)local_240.fFancy ^ 1;
    goto LAB_002142ff;
  case 0x67:
    local_240.fDelayOpt = local_240.fDelayOpt ^ 1;
    goto LAB_002142ff;
  case 0x69:
    local_240.fUseCofVars = local_240.fUseCofVars ^ 1;
    goto LAB_002142ff;
  case 0x6a:
    local_240.fEnableCheck07 = local_240.fEnableCheck07 ^ 1;
    goto LAB_002142ff;
  case 0x6b:
    local_240.fUseDsdTune = local_240.fUseDsdTune ^ 1;
    goto LAB_002142ff;
  case 0x6c:
    local_240.fLatchPaths = local_240.fLatchPaths ^ 1;
    goto LAB_002142ff;
  case 0x6d:
    local_240.fCutMin = local_240.fCutMin ^ 1;
    goto LAB_002142ff;
  case 0x6e:
    local_240.fUseDsd = local_240.fUseDsd ^ 1;
    goto LAB_002142ff;
  case 0x6f:
    local_240.fUseBuffs = local_240.fUseBuffs ^ 1;
    goto LAB_002142ff;
  case 0x70:
    local_240.fPower = local_240.fPower ^ 1;
    goto LAB_002142ff;
  case 0x71:
    local_240.fPreprocess = local_240.fPreprocess ^ 1;
    goto LAB_002142ff;
  case 0x72:
    local_240.fExpRed = local_240.fExpRed ^ 1;
    goto LAB_002142ff;
  case 0x73:
    local_240.fDelayOptLut = local_240.fDelayOptLut ^ 1;
    goto LAB_002142ff;
  case 0x74:
    local_240.fDoAverage = local_240.fDoAverage ^ 1;
    goto LAB_002142ff;
  case 0x76:
    local_240.fVerbose = local_240.fVerbose ^ 1;
    goto LAB_002142ff;
  case 0x78:
    local_240.fDsdBalance = local_240.fDsdBalance ^ 1;
    goto LAB_002142ff;
  case 0x79:
    local_240.fUserRecLib = local_240.fUserRecLib ^ 1;
    goto LAB_002142ff;
  default:
    if (iVar2 == -1) {
      if (pAVar7 == (Abc_Ntk_t *)0x0) {
        pcVar12 = "Empty network.\n";
        goto LAB_00214e73;
      }
      if (local_240.nLutSize == 0xffffffff) {
        if (local_240.pLutLib == (If_LibLut_t *)0x0) {
          pcVar12 = "The LUT library is not given.\n";
          goto LAB_00214e73;
        }
        local_240.nLutSize = (local_240.pLutLib)->LutMax;
      }
      uVar10 = (ulong)(uint)local_240.nLutSize;
      if (local_240.nLutSize - 0x21U < 0xffffffe1) {
        pcVar12 = "Incorrect LUT size (%d).\n";
        goto LAB_0021471a;
      }
      if (local_240.nCutsMax - 0x1000U < 0xfffff001) {
        pcVar12 = "Incorrect number of cuts.\n";
      }
      else {
        iVar3 = Abc_NtkGetChoiceNum(pAVar7);
        if (iVar3 != 0) {
          local_240.fExpRed = 0;
        }
        if (local_240.fUseBat != 0) {
          if (local_240.nLutSize - 7U < 0xfffffffd) {
            pcVar12 = "This feature only works for {4,5,6}-LUTs.\n";
            goto LAB_00214e73;
          }
          local_240.fCutMin = 1;
        }
        if ((int)((local_240.fUseCofVars + local_240.fEnableCheck07 + local_240.fUseDsdTune + 1) -
                 (uint)(local_240.pLutStruct == (char *)0x0)) < 2) {
          if (local_240.fEnableCheck07 != 0) {
            if (local_240.nLutSize - 8U < 0xfffffffe) {
              pcVar12 = "This feature only works for {6,7}-LUTs.\n";
              goto LAB_00214e73;
            }
            local_240.pFuncCell = If_CutPerformCheck07;
            local_240.fCutMin = 1;
          }
          if (local_240.fUseCofVars != 0) {
            if ((local_240.nLutSize & 1U) == 0) {
              pcVar12 = "This feature only works for odd-sized LUTs.\n";
              goto LAB_00214e73;
            }
            local_240.fCutMin = 1;
          }
          if (local_240.fUseDsdTune == 0) {
LAB_00214e2a:
            if (local_240.pLutStruct == (char *)0x0) {
LAB_00214e8f:
              if (local_240.fCutMin != 0) {
                local_240.fTruth = 1;
                local_240.fExpRed = 0;
              }
              if (local_240.fUserRecLib != 0) {
                local_240.fTruth = 1;
                local_240.fUsePerm = 1;
                local_240.fCutMin = 1;
                local_240.fExpRed = 0;
                local_240.pLutLib = (If_LibLut_t *)0x0;
              }
              if ((local_240.fDelayOpt != 0 || local_240.fDsdBalance != 0) ||
                  local_240.fDelayOptLut != 0) {
                local_240.fTruth = 1;
                local_240.fCutMin = 1;
                local_240.fExpRed = 0;
                local_240.fUseDsd = (int)(local_240.fDsdBalance != 0 || local_240.fDelayOptLut != 0)
                ;
                local_240.pLutLib = (If_LibLut_t *)0x0;
              }
              if (0 < local_240.nGateSize) {
                local_240.fTruth = 1;
                local_240.fUsePerm = 1;
                local_240.fCutMin = 1;
                local_240.fExpRed = 0;
                local_240.pLutLib = (If_LibLut_t *)0x0;
                local_240.nLutSize = local_240.nGateSize;
              }
              if (local_240.fUseTtPerm != 0 || local_240.fUseDsd != 0) {
                local_240.fTruth = 1;
                local_240.fCutMin = 1;
                local_240.fExpRed = 0;
              }
              if (local_240.fUseDsd != 0) {
                uVar5 = 0;
                if ((local_240.pLutStruct != (char *)0x0) &&
                   (uVar5 = 0, local_240.pLutStruct[2] == '\0')) {
                  uVar5 = (int)*local_240.pLutStruct - 0x30;
                }
                pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
                iVar3 = local_240.nLutSize;
                if ((local_240.pLutStruct == (char *)0x0) || (local_240.pLutStruct[2] == '\0')) {
                  if (pIVar9 != (If_DsdMan_t *)0x0) {
                    iVar2 = If_DsdManVarNum(pIVar9);
                    if (iVar2 < iVar3) {
                      pcVar12 = "DSD manager has incompatible number of variables.";
                    }
                    else {
                      uVar6 = If_DsdManLutSize(pIVar9);
                      if ((uVar5 == uVar6) || (local_240.fDsdBalance != 0)) {
                        if (pIVar9 == (If_DsdMan_t *)0x0) goto LAB_00215009;
                        goto LAB_00215198;
                      }
                      pcVar12 = "DSD manager has different LUT size.";
                    }
                    goto LAB_00214ff6;
                  }
LAB_00215009:
                  if ((0xc < (int)uVar5) || (0xc < local_240.nLutSize)) {
                    printf("Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                           ,(ulong)uVar5,0xc);
                    goto LAB_00215033;
                  }
                  pIVar9 = If_DsdManAlloc(local_240.nLutSize,uVar5);
                  Abc_FrameSetManDsd(pIVar9);
LAB_00215198:
                  iVar3 = 1;
                  bVar1 = true;
                }
                else {
                  pcVar12 = "DSD only works for LUT structures XY.";
LAB_00214ff6:
                  puts(pcVar12);
LAB_00215033:
                  bVar1 = false;
                  iVar3 = 0;
                }
                if (!bVar1) {
                  return iVar3;
                }
              }
              if (local_240.fUserRecLib != 0) {
                iVar3 = Abc_NtkRecIsRunning3();
                if (iVar3 == 0) {
                  puts("LMS manager is not running (use \"rec_start3\").");
                  return 0;
                }
                uVar5 = Abc_NtkRecInputNum3();
                if (uVar5 != local_240.nLutSize) {
                  uVar5 = Abc_NtkRecInputNum3();
                  printf("The number of library inputs (%d) different from the K parameters (%d).\n"
                         ,(ulong)uVar5,(ulong)(uint)local_240.nLutSize);
                  return 0;
                }
              }
              if ((local_240.fTruth != 0) && (0xf < local_240.nLutSize)) {
                pcVar12 = "Truth tables cannot be computed for LUT larger than %d inputs.\n";
                uVar10 = 0xf;
LAB_0021471a:
                Abc_Print(-1,pcVar12,uVar10);
                return 1;
              }
              if (pAVar7->ntkType == ABC_NTK_STRASH) {
                pAVar7 = Abc_NtkIf(pAVar7,&local_240);
joined_r0x00215165:
                if (pAVar7 != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(local_110,pAVar7);
                  return 0;
                }
                pcVar12 = "FPGA mapping has failed.\n";
                iVar3 = 0;
              }
              else {
                pAVar7 = Abc_NtkStrash(pAVar7,0,0,0);
                if (pAVar7 == (Abc_Ntk_t *)0x0) {
                  pcVar12 = "Strashing before FPGA mapping has failed.\n";
                  goto LAB_00214e73;
                }
                iVar3 = 1;
                pNtk = Abc_NtkBalance(pAVar7,0,0,1);
                Abc_NtkDelete(pAVar7);
                if (pNtk != (Abc_Ntk_t *)0x0) {
                  pcVar12 = Abc_FrameReadFlag("silentmode");
                  if (pcVar12 == (char *)0x0) {
                    Abc_Print(1,"The network was strashed and balanced before FPGA mapping.\n");
                  }
                  pAVar7 = Abc_NtkIf(pNtk,&local_240);
                  Abc_NtkDelete(pNtk);
                  goto joined_r0x00215165;
                }
                pcVar12 = "Balancing before FPGA mapping has failed.\n";
              }
              iVar2 = -1;
LAB_002147af:
              Abc_Print(iVar2,pcVar12);
              return iVar3;
            }
            if (local_240.fDsdBalance == 0) {
              if (0xfffffff4 < local_240.nLutSize - 0x11U) {
                if (local_240.fDelayOptLut == 0) {
                  local_240.pFuncCell = If_CutPerformCheck16;
                }
                else {
                  local_240.pFuncCell = (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0;
                }
                local_240.fCutMin = 1;
                goto LAB_00214e8f;
              }
              pcVar12 = "This feature only works for [6;16]-LUTs.\n";
            }
            else {
              pcVar12 = "Incompatible options (-S and -x).\n";
            }
          }
          else {
            pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
            iVar3 = local_240.nLutSize;
            if (pIVar9 == (If_DsdMan_t *)0x0) {
              pcVar12 = "DSD manager is not available.\n";
            }
            else {
              iVar4 = If_DsdManVarNum(pIVar9);
              iVar2 = local_240.nLutSize;
              if (iVar4 < iVar3) {
                uVar5 = If_DsdManVarNum(pIVar9);
                Abc_Print(-1,
                          "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n"
                          ,(ulong)(uint)iVar2,(ulong)uVar5);
                return 1;
              }
              if ((local_240.fDeriveLuts == 0) ||
                 (pcVar12 = If_DsdManGetCellStr(pIVar9), pcVar12 != (char *)0x0)) {
                local_240.fCutMin = 1;
                local_240.fUseDsd = 1;
                If_DsdManSetNewAsUseless(pIVar9);
                goto LAB_00214e2a;
              }
              pcVar12 = "DSD manager is not matched with any particular cell.\n";
            }
          }
        }
        else {
          pcVar12 = "Only one additional check can be performed at the same time.\n";
        }
      }
LAB_00214e73:
      iVar3 = -1;
      goto LAB_00214c96;
    }
    goto switchD_00214320_caseD_42;
  }
  Abc_Print(-1,pcVar12);
  goto switchD_00214320_caseD_42;
}

Assistant:

int Abc_CommandIf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    char Buffer[100], LutSize[100];
    Abc_Ntk_t * pNtk, * pNtkRes;
    If_Par_t Pars, * pPars = &Pars;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);
    If_ManSetDefaultPars( pPars );
    pPars->pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAGRNTXYDEWSqaflepmrsdbgxyojiktncvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            // if the LUT size is specified, disable library
            pPars->pLutLib = NULL;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaIters < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nGateSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGateSize < 2 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nNonDecLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonDecLimit < 2 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nStructType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStructType < 0 || pPars->nStructType > 2 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndArea < 0 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndArea = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndDelay < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->Epsilon = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Epsilon < 0.0 || pPars->Epsilon > 1.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->WireDelay = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->WireDelay < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pLutStruct = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( strlen(pPars->pLutStruct) != 2 && strlen(pPars->pLutStruct) != 3 )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                goto usage;
            }
            break;
        case 'q':
            pPars->fPreprocess ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fExpRed ^= 1;
            break;
        case 'f':
            pPars->fFancy ^= 1;
            break;
        case 'l':
            pPars->fLatchPaths ^= 1;
            break;
        case 'e':
            pPars->fEdge ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 's':
            pPars->fDelayOptLut ^= 1;
            break;
        case 'd':
            pPars->fBidec ^= 1;
            break;
        case 'b':
            pPars->fUseBat ^= 1;
            break;
        case 'g':
            pPars->fDelayOpt ^= 1;
            break;
        case 'x':
            pPars->fDsdBalance ^= 1;
            break;
        case 'y':
            pPars->fUserRecLib ^= 1;
            break;
        case 'o':
            pPars->fUseBuffs ^= 1;
            break;
        case 'j':
            pPars->fEnableCheck07 ^= 1;
            break;
        case 'i':
            pPars->fUseCofVars ^= 1;
            break;
        case 'k':
            pPars->fUseDsdTune ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'n':
            pPars->fUseDsd ^= 1;
            break;
        case 'c':
            pPars->fUseTtPerm ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            Abc_Print( -1, "The LUT library is not given.\n" );
            return 1;
        }
        pPars->nLutSize = pPars->pLutLib->LutMax;
    }

    if ( pPars->nLutSize < 2 || pPars->nLutSize > IF_MAX_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", pPars->nLutSize );
        return 1;
    }

    if ( pPars->nCutsMax < 1 || pPars->nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    // enable truth table computation if choices are selected
    if ( (c = Abc_NtkGetChoiceNum( pNtk )) )
    {
//        if ( !Abc_FrameReadFlag("silentmode") )
//            Abc_Print( 0, "Performing LUT mapping with %d choices.\n", c );
        pPars->fExpRed = 0;
    }

    if ( pPars->fUseBat )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature only works for {4,5,6}-LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }

    if ( pPars->fEnableCheck07 + pPars->fUseCofVars + pPars->fUseDsdTune + (pPars->pLutStruct != NULL) > 1 )
    {
        Abc_Print( -1, "Only one additional check can be performed at the same time.\n" );
        return 1;
    }
    if ( pPars->fEnableCheck07 )
    {
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 7 )
        {
            Abc_Print( -1, "This feature only works for {6,7}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck07;
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseCofVars )
    {
        if ( !(pPars->nLutSize & 1) )
        {
            Abc_Print( -1, "This feature only works for odd-sized LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseDsdTune )
    {
        If_DsdMan_t * pDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pDsdMan == NULL )
        {
            Abc_Print( -1, "DSD manager is not available.\n" );
            return 1;
        }
        if ( pPars->nLutSize > If_DsdManVarNum(pDsdMan) )
        {
            Abc_Print( -1, "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n", pPars->nLutSize, If_DsdManVarNum(pDsdMan) );
            return 1;
        }
        if ( pPars->fDeriveLuts && If_DsdManGetCellStr(pDsdMan) == NULL )
        {
            Abc_Print( -1, "DSD manager is not matched with any particular cell.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
        pPars->fUseDsd = 1;
        If_DsdManSetNewAsUseless( pDsdMan );
    }
    if ( pPars->pLutStruct )
    {
        if ( pPars->fDsdBalance )
        {
            Abc_Print( -1, "Incompatible options (-S and -x).\n" );
            return 1;
        }
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 16 )
        {
            Abc_Print( -1, "This feature only works for [6;16]-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = pPars->fDelayOptLut ? NULL : If_CutPerformCheck16;
        pPars->fCutMin = 1;
    }

    // enable truth table computation if cut minimization is selected
    if ( pPars->fCutMin )
    {
        pPars->fTruth = 1;
        pPars->fExpRed = 0;
    }
    // modify the subgraph recording
    if ( pPars->fUserRecLib )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fDelayOptLut )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUseDsd     =  pPars->fDsdBalance || pPars->fDelayOptLut;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->nGateSize > 0 )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
        pPars->nLutSize    =  pPars->nGateSize;
    }

    if ( pPars->fUseDsd || pPars->fUseTtPerm )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
    }

    if ( pPars->fUseDsd )
    {
        int LutSize = (pPars->pLutStruct && pPars->pLutStruct[2] == 0)? pPars->pLutStruct[0] - '0' : 0;
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->pLutStruct && pPars->pLutStruct[2] != 0 )
        {
            printf( "DSD only works for LUT structures XY.\n" );
            return 0;
        }
        if ( p && pPars->nLutSize > If_DsdManVarNum(p) )
        {
            printf( "DSD manager has incompatible number of variables.\n" );
            return 0;
        }
        if ( p && LutSize != If_DsdManLutSize(p) && !pPars->fDsdBalance )
        {
            printf( "DSD manager has different LUT size.\n" );
            return 0;
        }
        if ( p == NULL )
        {
            if ( LutSize > DAU_MAX_VAR || pPars->nLutSize > DAU_MAX_VAR )
            {
                printf( "Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", LutSize, DAU_MAX_VAR );
                return 0;
            }
            Abc_FrameSetManDsd( If_DsdManAlloc(pPars->nLutSize, LutSize) );
        }
    }

    if ( pPars->fUserRecLib )
    {
        if ( !Abc_NtkRecIsRunning3() )
        {
            printf( "LMS manager is not running (use \"rec_start3\").\n" );
            return 0;
        }
        if ( Abc_NtkRecInputNum3() != pPars->nLutSize )
        {
            printf( "The number of library inputs (%d) different from the K parameters (%d).\n", Abc_NtkRecInputNum3(), pPars->nLutSize );
            return 0;
        }
    }
 
    // complain if truth tables are requested but the cut size is too large
    if ( pPars->fTruth && pPars->nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Truth tables cannot be computed for LUT larger than %d inputs.\n", IF_MAX_FUNC_LUTSIZE );
        return 1;
    }

    // disable cut-expansion if edge-based heuristics are selected
//    if ( pPars->fEdge )
//        pPars->fExpRed = 0;

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        // strash and balance the network
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Strashing before FPGA mapping has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkBalance( pNtkRes = pNtk, 0, 0, 1 );
        Abc_NtkDelete( pNtkRes );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Balancing before FPGA mapping has failed.\n" );
            return 1;
        }
        if ( !Abc_FrameReadFlag("silentmode") )
            Abc_Print( 1, "The network was strashed and balanced before FPGA mapping.\n" );
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_NtkDelete( pNtk );
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
        Abc_NtkDelete( pNtk );
    }
    else
    {
        // get the new network
        pNtkRes = Abc_NtkIf( pNtk, pPars );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "FPGA mapping has failed.\n" );
            return 0;
        }
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%.2f", pPars->DelayTarget );
    if ( pPars->nLutSize == -1 )
        sprintf(LutSize, "library" );
    else
        sprintf(LutSize, "%d", pPars->nLutSize );
    Abc_Print( -2, "usage: if [-KCFAGRNTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyojiktncvh]\n" );
    Abc_Print( -2, "\t           performs FPGA technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n", IF_MAX_LUTSIZE+1, LutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n", pPars->nFlowIters );
    Abc_Print( -2, "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n", pPars->nAreaIters );
    Abc_Print( -2, "\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n", pPars->nGateSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-N num   : the max size of non-decomposable nodes [default = unused]\n", pPars->nNonDecLimit );
    Abc_Print( -2, "\t-T num   : the type of LUT structures [default = any]\n" );
    Abc_Print( -2, "\t-X num   : delay of AND-gate in LUT library units [default = %d]\n", pPars->nAndDelay );
    Abc_Print( -2, "\t-Y num   : area of AND-gate in LUT library units [default = %d]\n", pPars->nAndArea );
    Abc_Print( -2, "\t-D float : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-E float : sets epsilon used for tie-breaking [default = %f]\n", pPars->Epsilon );
    Abc_Print( -2, "\t-W float : sets wire delay between adjects LUTs [default = %f]\n", pPars->WireDelay );
    Abc_Print( -2, "\t-S str   : string representing the LUT structure [default = %s]\n", pPars->pLutStruct ? pPars->pLutStruct : "not used" );
    Abc_Print( -2, "\t-q       : toggles preprocessing using several starting points [default = %s]\n", pPars->fPreprocess? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : enables expansion/reduction of the best cuts [default = %s]\n", pPars->fExpRed? "yes": "no" );
    Abc_Print( -2, "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n", pPars->fLatchPaths? "yes": "no" );
    Abc_Print( -2, "\t-e       : uses edge-based cut selection heuristics [default = %s]\n", pPars->fEdge? "yes": "no" );
    Abc_Print( -2, "\t-p       : uses power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n", pPars->fDelayOptLut? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles deriving local AIGs using bi-decomposition [default = %s]\n", pPars->fBidec? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggles the use of one special feature [default = %s]\n", pPars->fUseBat? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles delay optimization by SOP balancing [default = %s]\n", pPars->fDelayOpt? "yes": "no" );
    Abc_Print( -2, "\t-x       : toggles delay optimization by DSD balancing [default = %s]\n", pPars->fDsdBalance? "yes": "no" );
    Abc_Print( -2, "\t-y       : toggles delay optimization with recorded library [default = %s]\n", pPars->fUserRecLib? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", pPars->fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck07? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggles using cofactoring variables [default = %s]\n", pPars->fUseCofVars? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n", pPars->fUseDsdTune? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-n       : toggles computing DSDs of the cut functions [default = %s]\n", pPars->fUseDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles computing truth tables in a new way [default = %s]\n", pPars->fUseTtPerm? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}